

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<char16_t>::emplace_back_impl<char16_t_const&>
          (QVLABase<char16_t> *this,qsizetype prealloc,void *array,char16_t *args)

{
  QVLABase<char16_t> *this_00;
  QVLABase<char16_t> *pQVar1;
  iterator ptr;
  char16_t *pcVar2;
  char16_t *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<char16_t> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<char16_t> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<char16_t> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = end(this_00);
  pcVar2 = q20::construct_at<char16_t,char16_t_const&,void>(ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return pcVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }